

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_TELEPORT_LEVEL(effect_handler_context_t_conflict *context)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  _Bool _Var5;
  wchar_t wVar6;
  uint32_t uVar7;
  monster_conflict *mon;
  loc lVar8;
  bool bVar9;
  char *fmt;
  
  wVar6 = dungeon_get_next_level(player,(int)player->max_depth,L'\x01');
  mon = (monster_conflict *)monster_target_monster(context);
  lVar8 = cave_find_decoy(cave);
  context->ident = true;
  if (player->upkeep->arena_level != false) {
    return true;
  }
  if (mon != (monster_conflict *)0x0) {
    add_monster_message(mon,L'\x15',false);
    delete_monster_idx((chunk *)cave,mon->midx);
    return true;
  }
  if (lVar8.x != L'\0' && (ulong)lVar8 >> 0x20 != 0) {
    square_destroy_decoy(cave,lVar8);
    return true;
  }
  lVar8.x = (player->grid).x;
  lVar8.y = (player->grid).y;
  _Var5 = square_isno_teleport(cave,lVar8);
  if (!_Var5) {
    _Var5 = player_of_has(player,L'\x19');
    if (!_Var5) {
      if (((context->origin).what == SRC_MONSTER) && (_Var5 = player_resists(player,L'\t'), _Var5))
      {
        fmt = "You resist the effect!";
        goto LAB_00140527;
      }
      if ((player->opts).opt[0x20] == false) {
        bVar3 = true;
        bVar2 = true;
        if (player->depth == 0) goto LAB_00140578;
      }
      else {
LAB_00140578:
        bVar3 = false;
        bVar2 = false;
      }
      bVar9 = true;
      if (!bVar2) {
        _Var5 = is_quest(player,wVar6);
        bVar9 = !_Var5;
      }
      _Var5 = is_quest(player,(int)player->depth);
      if ((_Var5) || ((int)(z_info->max_depth - 1) <= (int)player->depth)) {
        bVar9 = false;
      }
      bVar4 = bVar9;
      if ((bVar2) && (bVar9)) {
        uVar7 = Rand_div(100);
        bVar4 = false;
        bVar2 = bVar3;
        if ((int)uVar7 < 0x32) {
          bVar2 = false;
          bVar4 = bVar9;
        }
      }
      if (bVar2) {
        msgt(0x19,"You rise up through the ceiling.");
        cmdq_flush();
        sVar1 = player->depth;
        wVar6 = L'\xffffffff';
LAB_00140658:
        wVar6 = dungeon_get_next_level(player,(int)sVar1,wVar6);
        dungeon_change_level(player,wVar6);
        return true;
      }
      if (bVar4) {
        msgt(0x19,"You sink through the floor.");
        cmdq_flush();
        if ((player->opts).opt[0x20] == true) {
          sVar1 = player->max_depth;
        }
        else {
          sVar1 = player->depth;
        }
        wVar6 = L'\x01';
        goto LAB_00140658;
      }
      fmt = "Nothing happens.";
      goto LAB_00140527;
    }
    equip_learn_flag(player,L'\x19');
  }
  fmt = "Teleportation forbidden!";
LAB_00140527:
  msg(fmt);
  return true;
}

Assistant:

bool effect_handler_TELEPORT_LEVEL(effect_handler_context_t *context)
{
	bool up = true;
	bool down = true;
	int target_depth = dungeon_get_next_level(player, player->max_depth, 1);
	struct monster *t_mon = monster_target_monster(context);
	struct loc decoy = cave_find_decoy(cave);

	context->ident = true;

	/* No teleporting in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Check for monster targeting another monster */
	if (t_mon) {
		/* Monster is just gone */
		add_monster_message(t_mon, MON_MSG_DISAPPEAR, false);
		delete_monster_idx(cave, t_mon->midx);
		return true;
	}

	/* Targeted decoys get destroyed */
	if (decoy.y && decoy.x) {
		square_destroy_decoy(cave, decoy);
		return true;
	}

	/* Check for a no teleport grid */
	if (square_isno_teleport(cave, player->grid)) {
		msg("Teleportation forbidden!");
		return true;
	}

	/* Check for a no teleport curse */
	if (player_of_has(player, OF_NO_TELEPORT)) {
		equip_learn_flag(player, OF_NO_TELEPORT);
		msg("Teleportation forbidden!");
		return true;
	}

	/* Resist hostile teleport */
	if (context->origin.what == SRC_MONSTER &&
			player_resists(player, ELEM_NEXUS)) {
		msg("You resist the effect!");
		return true;
	}

	/* No going up with force_descend or in the town */
	if (OPT(player, birth_force_descend) || !player->depth)
		up = false;

	/* No forcing player down to quest levels if they can't leave */
	if (!up && is_quest(player, target_depth))
		down = false;

	/* Can't leave quest levels or go down deeper than the dungeon */
	if (is_quest(player, player->depth)
			|| (player->depth >= z_info->max_depth - 1))
		down = false;

	/* Determine up/down if not already done */
	if (up && down) {
		if (randint0(100) < 50)
			up = false;
		else
			down = false;
	}

	/*
	 * Now actually do the level change; flush the command queue to
	 * prevent the character from losing an action when first entering
	 * the new level (for instance, player moves putting an autopickup
	 * command in the queue and is then hit by a teleport level spell)
	 */
	if (up) {
		msgt(MSG_TPLEVEL, "You rise up through the ceiling.");
		cmdq_flush();
		target_depth = dungeon_get_next_level(player,
			player->depth, -1);
		dungeon_change_level(player, target_depth);
	} else if (down) {
		msgt(MSG_TPLEVEL, "You sink through the floor.");

		cmdq_flush();
		if (OPT(player, birth_force_descend)) {
			target_depth = dungeon_get_next_level(player,
				player->max_depth, 1);
			dungeon_change_level(player, target_depth);
		} else {
			target_depth = dungeon_get_next_level(player,
				player->depth, 1);
			dungeon_change_level(player, target_depth);
		}
	} else {
		msg("Nothing happens.");
	}

	return true;
}